

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_checkstack(FuncState *fs,int n)

{
  uint uVar1;
  
  uVar1 = (uint)fs->freereg + n;
  if ((int)(uint)fs->f->maxstacksize < (int)uVar1) {
    if (0xfe < uVar1) {
      luaX_syntaxerror(fs->ls,"function or expression needs too many registers");
    }
    fs->f->maxstacksize = (lu_byte)uVar1;
  }
  return;
}

Assistant:

void luaK_checkstack (FuncState *fs, int n) {
  int newstack = fs->freereg + n;
  if (newstack > fs->f->maxstacksize) {
    if (newstack >= MAXREGS)
      luaX_syntaxerror(fs->ls,
        "function or expression needs too many registers");
    fs->f->maxstacksize = cast_byte(newstack);
  }
}